

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sljitNativeX86_common.c
# Opt level: O2

sljit_s32 emit_shift(sljit_compiler *compiler,sljit_u8 mode,sljit_s32 dst,sljit_sw dstw,
                    sljit_s32 src1,sljit_sw src1w,sljit_s32 src2,sljit_sw src2w)

{
  int iVar1;
  sljit_s32 sVar2;
  byte *pbVar3;
  
  if (src2 == 4 || (src2 & 0x40U) != 0) {
    if (dstw == src1w && dst == src1) {
      pbVar3 = emit_x86_instruction(compiler,0x21,src2,src2w,dst,dstw);
      if (pbVar3 != (byte *)0x0) {
        *pbVar3 = *pbVar3 | mode;
        return 0;
      }
      goto LAB_0013cfab;
    }
    if (dst == 0) {
      sVar2 = emit_mov(compiler,0xf,0,src1,src1w);
      if (sVar2 != 0) goto LAB_0013cfab;
      dst = 0xf;
    }
    else {
      if (dst == 4 && src2 == 4) {
        iVar1 = emit_mov(compiler,0xf,0,src1,src1w);
        goto joined_r0x0013ccca;
      }
      if (0x3f < dst) {
        sVar2 = emit_mov(compiler,0xf,0,src1,src1w);
        if ((sVar2 != 0) ||
           (pbVar3 = emit_x86_instruction(compiler,0x21,src2,src2w,0xf,0), pbVar3 == (byte *)0x0))
        goto LAB_0013cfab;
        *pbVar3 = *pbVar3 | mode;
        goto LAB_0013cd41;
      }
      sVar2 = emit_mov(compiler,dst,0,src1,src1w);
      if (sVar2 != 0) goto LAB_0013cfab;
    }
    pbVar3 = emit_x86_instruction(compiler,0x21,src2,src2w,dst,0);
    if (pbVar3 != (byte *)0x0) {
      *pbVar3 = *pbVar3 | mode;
      return 0;
    }
  }
  else {
    if (dst == 4) {
      sVar2 = emit_mov(compiler,0xf,0,src1,src1w);
      if (sVar2 != 0) goto LAB_0013cfab;
      iVar1 = emit_mov(compiler,4,0,src2,src2w);
joined_r0x0013ccca:
      if (iVar1 != 0) goto LAB_0013cfab;
      dst = 0xf;
    }
    else {
      if ((dst == src2 || dst - 0x40U < 0xffffffc1) ||
         (((char)src2 < '\0' && (((src2 & 0x3fU) == dst || (((uint)src2 >> 8 & 0x3f) == dst)))))) {
        sVar2 = emit_mov(compiler,0xf,0,src1,src1w);
        if ((sVar2 == 0) &&
           (((sVar2 = emit_mov(compiler,0x10,0,4,0), sVar2 == 0 &&
             (sVar2 = emit_mov(compiler,4,0,src2,src2w), sVar2 == 0)) &&
            (pbVar3 = emit_x86_instruction(compiler,0x21,4,0,0xf,0), pbVar3 != (byte *)0x0)))) {
          *pbVar3 = *pbVar3 | mode;
          sVar2 = emit_mov(compiler,4,0,0x10,0);
          if (sVar2 == 0) {
            if (dst == 0) {
              return 0;
            }
            sVar2 = emit_mov(compiler,dst,dstw,0xf,0);
            return sVar2;
          }
        }
        goto LAB_0013cfab;
      }
      if (((src1 != dst) && (sVar2 = emit_mov(compiler,dst,0,src1,src1w), sVar2 != 0)) ||
         ((sVar2 = emit_mov(compiler,0xf,0,4,0), sVar2 != 0 ||
          (sVar2 = emit_mov(compiler,4,0,src2,src2w), sVar2 != 0)))) goto LAB_0013cfab;
    }
    pbVar3 = emit_x86_instruction(compiler,0x21,4,0,dst,0);
    if (pbVar3 == (byte *)0x0) goto LAB_0013cfab;
    *pbVar3 = *pbVar3 | mode;
    dst = 4;
    dstw = 0;
LAB_0013cd41:
    sVar2 = emit_mov(compiler,dst,dstw,0xf,0);
    if (sVar2 == 0) {
      return 0;
    }
  }
LAB_0013cfab:
  return compiler->error;
}

Assistant:

static sljit_s32 emit_shift(struct sljit_compiler *compiler,
	sljit_u8 mode,
	sljit_s32 dst, sljit_sw dstw,
	sljit_s32 src1, sljit_sw src1w,
	sljit_s32 src2, sljit_sw src2w)
{
	sljit_u8* inst;

	if ((src2 & SLJIT_IMM) || (src2 == SLJIT_PREF_SHIFT_REG)) {
		if (dst == src1 && dstw == src1w) {
			inst = emit_x86_instruction(compiler, 1 | EX86_SHIFT_INS, src2, src2w, dst, dstw);
			FAIL_IF(!inst);
			*inst |= mode;
			return SLJIT_SUCCESS;
		}
		if (dst == SLJIT_UNUSED) {
			EMIT_MOV(compiler, TMP_REG1, 0, src1, src1w);
			inst = emit_x86_instruction(compiler, 1 | EX86_SHIFT_INS, src2, src2w, TMP_REG1, 0);
			FAIL_IF(!inst);
			*inst |= mode;
			return SLJIT_SUCCESS;
		}
		if (dst == SLJIT_PREF_SHIFT_REG && src2 == SLJIT_PREF_SHIFT_REG) {
			EMIT_MOV(compiler, TMP_REG1, 0, src1, src1w);
			inst = emit_x86_instruction(compiler, 1 | EX86_SHIFT_INS, SLJIT_PREF_SHIFT_REG, 0, TMP_REG1, 0);
			FAIL_IF(!inst);
			*inst |= mode;
			EMIT_MOV(compiler, SLJIT_PREF_SHIFT_REG, 0, TMP_REG1, 0);
			return SLJIT_SUCCESS;
		}
		if (FAST_IS_REG(dst)) {
			EMIT_MOV(compiler, dst, 0, src1, src1w);
			inst = emit_x86_instruction(compiler, 1 | EX86_SHIFT_INS, src2, src2w, dst, 0);
			FAIL_IF(!inst);
			*inst |= mode;
			return SLJIT_SUCCESS;
		}

		EMIT_MOV(compiler, TMP_REG1, 0, src1, src1w);
		inst = emit_x86_instruction(compiler, 1 | EX86_SHIFT_INS, src2, src2w, TMP_REG1, 0);
		FAIL_IF(!inst);
		*inst |= mode;
		EMIT_MOV(compiler, dst, dstw, TMP_REG1, 0);
		return SLJIT_SUCCESS;
	}

	if (dst == SLJIT_PREF_SHIFT_REG) {
		EMIT_MOV(compiler, TMP_REG1, 0, src1, src1w);
		EMIT_MOV(compiler, SLJIT_PREF_SHIFT_REG, 0, src2, src2w);
		inst = emit_x86_instruction(compiler, 1 | EX86_SHIFT_INS, SLJIT_PREF_SHIFT_REG, 0, TMP_REG1, 0);
		FAIL_IF(!inst);
		*inst |= mode;
		EMIT_MOV(compiler, SLJIT_PREF_SHIFT_REG, 0, TMP_REG1, 0);
	}
	else if (SLOW_IS_REG(dst) && dst != src2 && !ADDRESSING_DEPENDS_ON(src2, dst)) {
		if (src1 != dst)
			EMIT_MOV(compiler, dst, 0, src1, src1w);
		EMIT_MOV(compiler, TMP_REG1, 0, SLJIT_PREF_SHIFT_REG, 0);
		EMIT_MOV(compiler, SLJIT_PREF_SHIFT_REG, 0, src2, src2w);
		inst = emit_x86_instruction(compiler, 1 | EX86_SHIFT_INS, SLJIT_PREF_SHIFT_REG, 0, dst, 0);
		FAIL_IF(!inst);
		*inst |= mode;
		EMIT_MOV(compiler, SLJIT_PREF_SHIFT_REG, 0, TMP_REG1, 0);
	}
	else {
		/* This case is complex since ecx itself may be used for
		   addressing, and this case must be supported as well. */
		EMIT_MOV(compiler, TMP_REG1, 0, src1, src1w);
#if (defined SLJIT_CONFIG_X86_32 && SLJIT_CONFIG_X86_32)
		EMIT_MOV(compiler, SLJIT_MEM1(SLJIT_SP), 0, SLJIT_PREF_SHIFT_REG, 0);
		EMIT_MOV(compiler, SLJIT_PREF_SHIFT_REG, 0, src2, src2w);
		inst = emit_x86_instruction(compiler, 1 | EX86_SHIFT_INS, SLJIT_PREF_SHIFT_REG, 0, TMP_REG1, 0);
		FAIL_IF(!inst);
		*inst |= mode;
		EMIT_MOV(compiler, SLJIT_PREF_SHIFT_REG, 0, SLJIT_MEM1(SLJIT_SP), 0);
#else
		EMIT_MOV(compiler, TMP_REG2, 0, SLJIT_PREF_SHIFT_REG, 0);
		EMIT_MOV(compiler, SLJIT_PREF_SHIFT_REG, 0, src2, src2w);
		inst = emit_x86_instruction(compiler, 1 | EX86_SHIFT_INS, SLJIT_PREF_SHIFT_REG, 0, TMP_REG1, 0);
		FAIL_IF(!inst);
		*inst |= mode;
		EMIT_MOV(compiler, SLJIT_PREF_SHIFT_REG, 0, TMP_REG2, 0);
#endif
		if (dst != SLJIT_UNUSED)
			return emit_mov(compiler, dst, dstw, TMP_REG1, 0);
	}

	return SLJIT_SUCCESS;
}